

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void make_error(png_store *ps,png_byte colour_type,png_byte bit_depth,int interlace_type,int test,
               png_const_charp name)

{
  jmp_buf *pa_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  char *name_00;
  png_byte colour_type_00;
  undefined4 in_register_00000084;
  anon_struct_8_1_898b5790 aVar7;
  png_structp pp;
  png_infop pi;
  png_uint_32 h;
  anon_struct_8_1_898b5790 local_520;
  jmp_buf *exception_prev_1;
  png_uint_32 w;
  jmp_buf exception__env;
  jmp_buf exception_env_1;
  
  pa_Var1 = pm.this.exception_context.penv;
  pm.this.exception_context.penv = &exception__env;
  iVar2 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
  if (iVar2 == 0) {
    local_520.etmp = (png_store *)pa_Var1;
    pp = set_store_for_write((png_store *)&pi,(png_infopp)CONCAT44(in_register_00000084,test),
                             name_00);
    make_volatile_for_gnu = &pp;
    if (pp == (png_structp)0x0) {
LAB_0010ebc0:
      pm.this.exception_context.v.etmp = &pm.this;
      longjmp((__jmp_buf_tag *)pm.this.exception_context.penv,1);
    }
    make_volatile_for_gnu = &w;
    w = 0x80;
    colour_type_00 = (png_byte)ps;
    h = transform_height(pp,colour_type_00,colour_type);
    make_volatile_for_gnu = &h;
    uVar4 = (uint)colour_type;
    iVar2 = (int)CONCAT71(in_register_00000011,bit_depth);
    png_set_IHDR(pp,pi,w,h,colour_type,(ulong)ps & 0xff,
                 CONCAT71(in_register_00000011,bit_depth) & 0xffffffff,0,0);
    if (colour_type_00 == '\x03') {
      init_standard_palette
                ((png_store *)pp,(png_structp)pi,(png_infop)(ulong)(uint)(1 << (colour_type & 0x1f))
                 ,0,uVar4);
    }
    exception_prev_1 = pm.this.exception_context.penv;
    pm.this.exception_context.penv = &exception_env_1;
    iVar3 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
    if (iVar3 == 0) {
      make_volatile_for_gnu = &exception_prev_1;
      pm.this._24_1_ =
           ((error_test[(uint)interlace_type].field_0x10 & 1) << 3 |
           pm.this._24_1_ & 0xe3 | error_test[(uint)interlace_type].field_0x10 * '\x04' & 4U) ^ 4;
      (*error_test[(uint)interlace_type].fn)(pp,pi);
      png_write_info(pp,pi);
      aVar7.etmp = local_520.etmp;
      if ((~pm.this._24_1_ & 0x18) == 0) goto LAB_0010ebc0;
      store_log(&pm.this,pp,error_test[(uint)interlace_type].msg,1);
      pm.this.exception_context.caught = 0;
    }
    else {
      pm.this.exception_context.caught = 1;
      aVar7.etmp = local_520.etmp;
    }
    if ((pm.this._24_1_ & 4) == 0) {
      pm.this.exception_context.penv = exception_prev_1;
      pm.this._24_1_ = pm.this._24_1_ & 0xf7;
      uVar6 = png_get_rowbytes(pp,pi);
      uVar4 = bit_size(pp,colour_type_00,colour_type);
      if (uVar6 != uVar4 << 4) {
        png_error(pp,"row size incorrect");
      }
      iVar3 = png_set_interlace_handling();
      iVar5 = 1;
      if (iVar2 != 0) {
        if (iVar2 != 1) {
          png_error(pp,"invalid interlace type");
        }
        iVar5 = 7;
      }
      if (iVar3 != iVar5) {
        png_error(pp,"write: png_set_interlace_handling failed");
      }
      if (0 < iVar3) {
        iVar2 = 0;
        do {
          if (h != 0) {
            uVar4 = 0;
            do {
              transform_row(pp,(png_byte *)exception_env_1,colour_type_00,colour_type,uVar4);
              png_write_row(pp,exception_env_1);
              uVar4 = uVar4 + 1;
            } while (uVar4 < h);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 != iVar3);
      }
      png_write_end(pp,pi);
      aVar7.etmp = local_520.etmp;
    }
    else {
      pm.this._24_1_ = pm.this._24_1_ & 0xf3;
      pm.this.exception_context.penv = exception_prev_1;
    }
    store_write_reset(&pm.this);
    pm.this.exception_context.caught = 0;
    pm.this.exception_context.penv = (jmp_buf *)aVar7.etmp;
  }
  else {
    pm.this.exception_context.caught = 1;
    pm.this.exception_context.penv = pa_Var1;
    store_write_reset(pm.this.exception_context.v.etmp);
  }
  return;
}

Assistant:

static void
make_error(png_store* const ps, png_byte const colour_type,
    png_byte bit_depth, int interlace_type, int test, png_const_charp name)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp = set_store_for_write(ps, &pi, name);
      png_uint_32 w, h;
      gnu_volatile(pp)

      if (pp == NULL)
         Throw ps;

      w = transform_width(pp, colour_type, bit_depth);
      gnu_volatile(w)
      h = transform_height(pp, colour_type, bit_depth);
      gnu_volatile(h)
      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
            PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 0/*do tRNS*/);

      /* Time for a few errors; these are in various optional chunks, the
       * standard tests test the standard chunks pretty well.
       */
#     define exception__prev exception_prev_1
#     define exception__env exception_env_1
      Try
      {
         gnu_volatile(exception__prev)

         /* Expect this to throw: */
         ps->expect_error = !error_test[test].warning;
         ps->expect_warning = error_test[test].warning;
         ps->saw_warning = 0;
         error_test[test].fn(pp, pi);

         /* Normally the error is only detected here: */
         png_write_info(pp, pi);

         /* And handle the case where it was only a warning: */
         if (ps->expect_warning && ps->saw_warning)
            Throw ps;

         /* If we get here there is a problem, we have success - no error or
          * no warning - when we shouldn't have success.  Log an error.
          */
         store_log(ps, pp, error_test[test].msg, 1 /*error*/);
      }

      Catch (fault)
      { /* expected exit */
      }
#undef exception__prev
#undef exception__env

      /* And clear these flags */
      ps->expect_warning = 0;

      if (ps->expect_error)
         ps->expect_error = 0;

      else
      {
         /* Now write the whole image, just to make sure that the detected, or
          * undetected, error has not created problems inside libpng.  This
          * doesn't work if there was a png_error in png_write_info because that
          * can abort before PLTE was written.
          */
         if (png_get_rowbytes(pp, pi) !=
             transform_rowsize(pp, colour_type, bit_depth))
            png_error(pp, "row size incorrect");

         else
         {
            int npasses = set_write_interlace_handling(pp, interlace_type);
            int pass;

            if (npasses != npasses_from_interlace_type(pp, interlace_type))
               png_error(pp, "write: png_set_interlace_handling failed");

            for (pass=0; pass<npasses; ++pass)
            {
               png_uint_32 y;

               for (y=0; y<h; ++y)
               {
                  png_byte buffer[TRANSFORM_ROWMAX];

                  transform_row(pp, buffer, colour_type, bit_depth, y);

#                 if do_own_interlace
                     /* If do_own_interlace *and* the image is interlaced we
                      * need a reduced interlace row; this may be reduced to
                      * empty.
                      */
                     if (interlace_type == PNG_INTERLACE_ADAM7)
                     {
                        /* The row must not be written if it doesn't exist,
                         * notice that there are two conditions here, either the
                         * row isn't ever in the pass or the row would be but
                         * isn't wide enough to contribute any pixels.  In fact
                         * the wPass test can be used to skip the whole y loop
                         * in this case.
                         */
                        if (PNG_ROW_IN_INTERLACE_PASS(y, pass) &&
                            PNG_PASS_COLS(w, pass) > 0)
                           interlace_row(buffer, buffer,
                                 bit_size(pp, colour_type, bit_depth), w, pass,
                                 0/*data always bigendian*/);
                        else
                           continue;
                     }
#                 endif /* do_own_interlace */

                  png_write_row(pp, buffer);
               }
            }
         } /* image writing */

         png_write_end(pp, pi);
      }

      /* The following deletes the file that was just written. */
      store_write_reset(ps);
   }

   Catch(fault)
   {
      store_write_reset(fault);
   }
}